

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_negation.c
# Opt level: O0

_Bool array_container_negation_range
                (array_container_t *src,int range_start,int range_end,container_t **dst)

{
  int iVar1;
  array_container_t *paVar2;
  bitset_container_t *pbVar3;
  undefined8 *in_RCX;
  uint32_t in_EDX;
  uint in_ESI;
  int32_t *in_RDI;
  int32_t val_in_range;
  int32_t in_pos;
  int32_t out_pos;
  array_container_t *arr;
  bitset_container_t *temp;
  int32_t new_cardinality;
  int32_t cardinality_change;
  int32_t new_values_in_range;
  int32_t span_to_be_flipped;
  int32_t current_values_in_range;
  int32_t last_index;
  int32_t start_index;
  undefined4 in_stack_ffffffffffffff98;
  int32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_58;
  int local_54;
  int local_28;
  int local_24;
  _Bool local_1;
  
  if ((int)in_ESI < (int)in_EDX) {
    local_24 = binarySearch(*(uint16_t **)(in_RDI + 2),*in_RDI,(uint16_t)in_ESI);
    if (local_24 < 0) {
      local_24 = -1 - local_24;
    }
    local_28 = binarySearch(*(uint16_t **)(in_RDI + 2),*in_RDI,(short)in_EDX - 1);
    if (local_28 < 0) {
      local_28 = -2 - local_28;
    }
    iVar1 = *in_RDI + (in_EDX - in_ESI) + ((local_28 - local_24) + 1) * -2;
    if (iVar1 < 0x1001) {
      paVar2 = array_container_create_given_capacity(in_stack_ffffffffffffff9c);
      *in_RCX = paVar2;
      if (iVar1 == 0) {
        paVar2->cardinality = 0;
        local_1 = false;
      }
      else {
        memcpy(paVar2->array,*(void **)(in_RDI + 2),(long)local_24 << 1);
        local_54 = local_24;
        local_58 = local_24;
        for (; (int)in_ESI < (int)in_EDX && local_58 <= local_28; in_ESI = in_ESI + 1) {
          if ((in_ESI & 0xffff) == (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_58 * 2)) {
            local_58 = local_58 + 1;
          }
          else {
            paVar2->array[local_54] = (uint16_t)in_ESI;
            local_54 = local_54 + 1;
          }
        }
        for (; (int)in_ESI < (int)in_EDX; in_ESI = in_ESI + 1) {
          paVar2->array[local_54] = (uint16_t)in_ESI;
          local_54 = local_54 + 1;
        }
        memcpy(paVar2->array + local_54,(void *)(*(long *)(in_RDI + 2) + (long)(local_28 + 1) * 2),
               (long)(*in_RDI - (local_28 + 1)) << 1);
        paVar2->cardinality = iVar1;
        local_1 = false;
      }
    }
    else {
      pbVar3 = bitset_container_from_array
                         ((array_container_t *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      bitset_flip_range(pbVar3->words,in_ESI,in_EDX);
      pbVar3->cardinality = iVar1;
      *in_RCX = pbVar3;
      local_1 = true;
    }
  }
  else {
    paVar2 = array_container_clone
                       ((array_container_t *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    *in_RCX = paVar2;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool array_container_negation_range(const array_container_t *src,
                                    const int range_start, const int range_end,
                                    container_t **dst) {
    /* close port of the Java implementation */
    if (range_start >= range_end) {
        *dst = array_container_clone(src);
        return false;
    }

    int32_t start_index =
        binarySearch(src->array, src->cardinality, (uint16_t)range_start);
    if (start_index < 0) start_index = -start_index - 1;

    int32_t last_index =
        binarySearch(src->array, src->cardinality, (uint16_t)(range_end - 1));
    if (last_index < 0) last_index = -last_index - 2;

    const int32_t current_values_in_range = last_index - start_index + 1;
    const int32_t span_to_be_flipped = range_end - range_start;
    const int32_t new_values_in_range =
        span_to_be_flipped - current_values_in_range;
    const int32_t cardinality_change =
        new_values_in_range - current_values_in_range;
    const int32_t new_cardinality = src->cardinality + cardinality_change;

    if (new_cardinality > DEFAULT_MAX_SIZE) {
        bitset_container_t *temp = bitset_container_from_array(src);
        bitset_flip_range(temp->words, (uint32_t)range_start,
                          (uint32_t)range_end);
        temp->cardinality = new_cardinality;
        *dst = temp;
        return true;
    }

    array_container_t *arr =
        array_container_create_given_capacity(new_cardinality);
    *dst = (container_t *)arr;
    if (new_cardinality == 0) {
        arr->cardinality = new_cardinality;
        return false;  // we are done.
    }
    // copy stuff before the active area
    memcpy(arr->array, src->array, start_index * sizeof(uint16_t));

    // work on the range
    int32_t out_pos = start_index, in_pos = start_index;
    int32_t val_in_range = range_start;
    for (; val_in_range < range_end && in_pos <= last_index; ++val_in_range) {
        if ((uint16_t)val_in_range != src->array[in_pos]) {
            arr->array[out_pos++] = (uint16_t)val_in_range;
        } else {
            ++in_pos;
        }
    }
    for (; val_in_range < range_end; ++val_in_range)
        arr->array[out_pos++] = (uint16_t)val_in_range;

    // content after the active range
    memcpy(arr->array + out_pos, src->array + (last_index + 1),
           (src->cardinality - (last_index + 1)) * sizeof(uint16_t));
    arr->cardinality = new_cardinality;
    return false;
}